

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::TcpSocket::SendBytes(TcpSocket *this,void *str,uint len)

{
  uint uVar1;
  int __fd;
  uchar *buf;
  int err;
  int ret;
  uint written;
  uint len_local;
  void *str_local;
  TcpSocket *this_local;
  
  if (len == 0) {
    this_local._7_1_ = true;
  }
  else if (this->_s == -1) {
    this_local._7_1_ = false;
  }
  else {
    err = 0;
    do {
      while( true ) {
        buf = (uchar *)((long)str + (ulong)(uint)err);
        uVar1 = _writeBytes(this,buf,(ulong)(len - err));
        __fd = (int)buf;
        if ((int)uVar1 < 1) break;
        if (len < uVar1) {
          __assert_fail("(unsigned)ret <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                        ,0x291,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
        }
        err = uVar1 + err;
        if (len <= (uint)err) {
          if (err == len) {
            return true;
          }
          __assert_fail("written == len",
                        "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                        ,0x2a0,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
        }
      }
    } while (-1 < (int)uVar1);
    if (uVar1 == 0xffffffff) {
      _GetError();
    }
    close(this,__fd);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TcpSocket::SendBytes(const void *str, unsigned int len)
{
    if(!len)
        return true;
    if(!SOCKETVALID(_s))
        return false;
    //traceprint("SEND: '%s'\n", str);

    unsigned written = 0;
    while(true) // FIXME: buffer bytes to an internal queue instead?
    {
        int ret = _writeBytes((const unsigned char*)str + written, len - written);
        if(ret > 0)
        {
            assert((unsigned)ret <= len);
            written += (unsigned)ret;
            if(written >= len)
                break;
        }
        else if(ret < 0)
        {
            int err = ret == -1 ? _GetError() : ret;
            traceprint("SendBytes: error %d: %s\n", err, _GetErrorStr(err).c_str());
            close();
            return false;
        }
        // and if ret == 0, keep trying.
    }

    assert(written == len);
    return true;
}